

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O1

MPP_RET append_interview_list
                  (H264_DpbBuf_t *p_Dpb,RK_S32 currPicStructure,RK_S32 list_idx,
                  H264_FrameStore_t **list,RK_S32 *listXsize,RK_S32 currPOC,RK_S32 curr_layer_id,
                  RK_S32 anchor_pic_flag)

{
  uint uVar1;
  H264_FrameStore_t *pHVar2;
  h264_subsps_t *phVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  
  if (curr_layer_id < 0) {
    if (((byte)h264d_debug & 4) == 0) {
      return MPP_ERR_VALUE;
    }
    _mpp_log_l(4,"h264d_init","value error(%d).\n",(char *)0x0,0x3c6);
    return MPP_ERR_VALUE;
  }
  pHVar2 = *p_Dpb->fs_ilref;
  uVar9 = (ulong)(list_idx != 0) * 0x10;
  lVar6 = uVar9 + 0x1060;
  uVar5 = uVar9 | 0x1068;
  if (anchor_pic_flag != 0) {
    lVar6 = uVar9 + 0x1040;
    uVar5 = uVar9 + 0x1048;
  }
  if (currPicStructure == 1) {
    bVar12 = false;
    iVar10 = 0;
    if ((pHVar2->is_used & 1) != 0) {
      lVar8 = 200;
      lVar7 = 0x58;
      goto LAB_0019b339;
    }
  }
  else if (currPicStructure == 3) {
    iVar10 = 0;
    bVar12 = pHVar2->is_used == 3;
    if (bVar12) {
      lVar8 = 0xc4;
      lVar7 = 0x50;
LAB_0019b339:
      lVar7 = *(long *)((long)pHVar2->inter_view_flag + lVar7 + -0x28);
      lVar11 = 4;
      if (*(char *)(lVar7 + 0xc0) != '\0') {
        lVar11 = lVar8;
      }
      iVar10 = *(int *)(lVar7 + lVar11);
      bVar12 = true;
    }
  }
  else {
    bVar12 = false;
    iVar10 = 0;
    if ((currPicStructure == 2) && (bVar12 = false, (pHVar2->is_used & 2) != 0)) {
      lVar8 = 0xcc;
      lVar7 = 0x60;
      goto LAB_0019b339;
    }
  }
  if (!bVar12) {
    return MPP_OK;
  }
  if (pHVar2->inter_view_flag[currPicStructure == 2] == 0) {
    return MPP_OK;
  }
  if (iVar10 != currPOC) {
    return MPP_OK;
  }
  phVar3 = p_Dpb->p_Vid->active_subsps;
  uVar1 = *(uint *)(*(long *)((long)(phVar3->sps).seq_scaling_list_present_flag + lVar6 + -0x30) +
                   (ulong)(uint)curr_layer_id * 4);
  bVar12 = 0 < (int)uVar1;
  if (0 < (int)uVar1) {
    piVar4 = *(int **)(*(long *)((long)(phVar3->sps).seq_scaling_list_present_flag + (uVar5 - 0x30))
                      + (ulong)(uint)curr_layer_id * 8);
    if (*piVar4 == pHVar2->view_id) goto LAB_0019b3bc;
    uVar5 = 1;
    do {
      uVar9 = uVar5;
      if (uVar1 == uVar9) break;
      uVar5 = uVar9 + 1;
    } while (piVar4[uVar9] != pHVar2->view_id);
    bVar12 = uVar9 < uVar1;
  }
  if (!bVar12) {
    return MPP_OK;
  }
LAB_0019b3bc:
  iVar10 = *listXsize;
  list[iVar10] = pHVar2;
  *listXsize = iVar10 + 1;
  return MPP_OK;
}

Assistant:

static MPP_RET append_interview_list(H264_DpbBuf_t *p_Dpb,
                                     RK_S32 currPicStructure, RK_S32 list_idx, H264_FrameStore_t **list,
                                     RK_S32 *listXsize, RK_S32 currPOC, RK_S32 curr_layer_id, RK_S32 anchor_pic_flag)
{
    RK_S32 poc = 0;
    RK_S32 fld_idx = 0;
    RK_U32 pic_avail = 0;
    RK_S32 num_ref_views = 0;
    RK_S32 *ref_view_id = NULL;
    MPP_RET ret = MPP_ERR_UNKNOW;
    RK_S32 iVOIdx = curr_layer_id;
    H264_FrameStore_t *fs = p_Dpb->fs_ilref[0];
    H264dVideoCtx_t *p_Vid = p_Dpb->p_Vid;

    VAL_CHECK(ret, iVOIdx >= 0); //!< Error: iVOIdx: %d is not less than 0
    if (anchor_pic_flag) {
        num_ref_views = list_idx ? p_Vid->active_subsps->num_anchor_refs_l1[iVOIdx] : p_Vid->active_subsps->num_anchor_refs_l0[iVOIdx];
        ref_view_id = list_idx ? p_Vid->active_subsps->anchor_ref_l1[iVOIdx] : p_Vid->active_subsps->anchor_ref_l0[iVOIdx];
    } else {
        num_ref_views = list_idx ? p_Vid->active_subsps->num_non_anchor_refs_l1[iVOIdx] : p_Vid->active_subsps->num_non_anchor_refs_l0[iVOIdx];
        ref_view_id = list_idx ? p_Vid->active_subsps->non_anchor_ref_l1[iVOIdx] : p_Vid->active_subsps->non_anchor_ref_l0[iVOIdx];
    }

    if (currPicStructure == BOTTOM_FIELD)
        fld_idx = 1;
    else
        fld_idx = 0;

    if (currPicStructure == FRAME) {
        pic_avail = (fs->is_used == 3);
        if (pic_avail) {
            poc = fs->frame->is_mmco_5 ? fs->frame->poc_mmco5 : fs->frame->poc;
        }
    } else if (currPicStructure == TOP_FIELD) {
        pic_avail = fs->is_used & 1;
        if (pic_avail) {
            poc = fs->top_field->is_mmco_5 ? fs->top_field->top_poc_mmco5 : fs->top_field->poc;
        }
    } else if (currPicStructure == BOTTOM_FIELD) {
        pic_avail = fs->is_used & 2;
        if (pic_avail) {
            poc = fs->bottom_field->is_mmco_5 ? fs->bottom_field->bot_poc_mmco5 : fs->bottom_field->poc;
        }
    } else {
        pic_avail = 0;
    }

    if (pic_avail && fs->inter_view_flag[fld_idx]) {
        if (poc == currPOC) {
            if (is_view_id_in_ref_view_list(fs->view_id, ref_view_id, num_ref_views)) {
                //!< add one inter-view reference;
                list[*listXsize] = fs;
                //!< next;
                (*listXsize)++;
            }
        }
    }
    return ret = MPP_OK;
__FAILED:
    return ret;
}